

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

int run_test_fork_socketpair_started(void)

{
  int iVar1;
  __pid_t child_pid;
  uint uVar2;
  uv_loop_t *puVar3;
  ssize_t sVar4;
  undefined8 uVar5;
  char *pcVar6;
  char sync_buf [1];
  int socket_fds [2];
  int sync_pipe [2];
  uv_poll_t poll_handle;
  
  iVar1 = pipe(sync_pipe);
  if (iVar1 == 0) {
    run_timer_loop_once();
    iVar1 = socketpair(1,1,0,socket_fds);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      iVar1 = uv_poll_init(puVar3,&poll_handle,socket_fds[0]);
      if (iVar1 == 0) {
        iVar1 = uv_poll_start(&poll_handle,1,socket_cb);
        if (iVar1 == 0) {
          puVar3 = uv_default_loop();
          iVar1 = uv_run(puVar3,UV_RUN_NOWAIT);
          if (iVar1 == 1) {
            child_pid = fork();
            if (child_pid == 0) {
              uVar2 = getpid();
              printf("Child is %d\n",(ulong)uVar2);
              sVar4 = read(sync_pipe[0],sync_buf,1);
              if (sVar4 != 1) {
                pcVar6 = "1 == read(sync_pipe[0], sync_buf, 1)";
                uVar5 = 0xca;
                goto LAB_00115adf;
              }
              puVar3 = uv_default_loop();
              iVar1 = uv_loop_fork(puVar3);
              if (iVar1 != 0) {
                pcVar6 = "0 == uv_loop_fork(uv_default_loop())";
                uVar5 = 0xcb;
                goto LAB_00115adf;
              }
              if (socket_cb_called != 0) {
                pcVar6 = "0 == socket_cb_called";
                uVar5 = 0xcc;
                goto LAB_00115adf;
              }
              puts("Going to run the loop in the child");
              socket_cb_read_fd = socket_fds[0];
              socket_cb_read_size = 1;
              puVar3 = uv_default_loop();
              iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
              if (iVar1 != 0) {
                pcVar6 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                uVar5 = 0xd1;
                goto LAB_00115adf;
              }
              if (socket_cb_called != 1) {
                pcVar6 = "1 == socket_cb_called";
                uVar5 = 0xd2;
                goto LAB_00115adf;
              }
              printf("Buf %s\n",socket_cb_read_buf);
              if (socket_cb_read_buf._0_4_ != 0xa6968) {
                pcVar6 = "0 == strcmp(\"hi\\n\", socket_cb_read_buf)";
                uVar5 = 0xd4;
                goto LAB_00115adf;
              }
            }
            else {
              if (child_pid == -1) {
                pcVar6 = "child_pid != -1";
                uVar5 = 0xb8;
                goto LAB_00115adf;
              }
              iVar1 = uv_poll_stop(&poll_handle);
              if (iVar1 != 0) {
                pcVar6 = "0 == uv_poll_stop(&poll_handle)";
                uVar5 = 0xbc;
                goto LAB_00115adf;
              }
              uv_close((uv_handle_t *)&poll_handle,(uv_close_cb)0x0);
              puVar3 = uv_default_loop();
              iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
              if (iVar1 != 0) {
                pcVar6 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                uVar5 = 0xbe;
                goto LAB_00115adf;
              }
              if (socket_cb_called != 0) {
                pcVar6 = "0 == socket_cb_called";
                uVar5 = 0xbf;
                goto LAB_00115adf;
              }
              sVar4 = write(sync_pipe[1],"1",1);
              if (sVar4 != 1) {
                pcVar6 = "1 == write(sync_pipe[1], \"1\", 1)";
                uVar5 = 0xc0;
                goto LAB_00115adf;
              }
              sVar4 = send(socket_fds[1],"hi\n",3,0);
              if (sVar4 != 3) {
                pcVar6 = "3 == send(socket_fds[1], \"hi\\n\", 3, 0)";
                uVar5 = 0xc1;
                goto LAB_00115adf;
              }
              puVar3 = uv_default_loop();
              iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
              if (iVar1 != 0) {
                pcVar6 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                uVar5 = 0xc3;
                goto LAB_00115adf;
              }
              if (socket_cb_called != 0) {
                pcVar6 = "0 == socket_cb_called";
                uVar5 = 0xc4;
                goto LAB_00115adf;
              }
              assert_wait_child(child_pid);
            }
            puVar3 = uv_default_loop();
            close_loop(puVar3);
            puVar3 = uv_default_loop();
            iVar1 = uv_loop_close(puVar3);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar6 = "0 == uv_loop_close(uv_default_loop())";
            uVar5 = 0xd7;
          }
          else {
            pcVar6 = "1 == uv_run(uv_default_loop(), UV_RUN_NOWAIT)";
            uVar5 = 0xb5;
          }
        }
        else {
          pcVar6 = "0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb)";
          uVar5 = 0xaf;
        }
      }
      else {
        pcVar6 = "0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0])";
        uVar5 = 0xae;
      }
    }
    else {
      pcVar6 = "0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds)";
      uVar5 = 0xab;
    }
  }
  else {
    pcVar6 = "0 == pipe(sync_pipe)";
    uVar5 = 0xa6;
  }
LAB_00115adf:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,uVar5,pcVar6);
  abort();
}

Assistant:

TEST_IMPL(fork_socketpair_started) {
  /* A socket opened in the parent and accept'd in the
     child works after a fork, even if the watcher was already
     started, and then stopped in the parent. */
  pid_t child_pid;
  int socket_fds[2];
  int sync_pipe[2];
  char sync_buf[1];
  uv_poll_t poll_handle;

  ASSERT(0 == pipe(sync_pipe));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds));

  /* Create and start the server watcher in the parent, use it in the child. */
  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0]));
  ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb));

  /* Run the loop AFTER the poll watcher is registered to make sure it
     gets passed to the kernel. Use NOWAIT and expect a non-zero
     return to prove the poll watcher is active.
  */
  ASSERT(1 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(0 == uv_poll_stop(&poll_handle));
    uv_close((uv_handle_t*)&poll_handle, NULL);
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(0 == socket_cb_called);
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert child */
    ASSERT(3 == send(socket_fds[1], "hi\n", 3, 0));

    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(0 == socket_cb_called);

    assert_wait_child(child_pid);
  } else {
    /* child */
    printf("Child is %d\n", getpid());
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for parent */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(0 == socket_cb_called);

    printf("Going to run the loop in the child\n");
    socket_cb_read_fd = socket_fds[0];
    socket_cb_read_size = 3;
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(1 == socket_cb_called);
    printf("Buf %s\n", socket_cb_read_buf);
    ASSERT(0 == strcmp("hi\n", socket_cb_read_buf));
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}